

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUpdateLeft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *eps,
                 number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *vec,int *nonz,int n)

{
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  int iVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  fpclass_type fVar5;
  int32_t iVar6;
  uint uVar7;
  bool bVar8;
  int iVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  long lVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  cpp_dec_float<200U,_int,_void> *v;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  uint *puVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  uint *puVar17;
  long lVar18;
  int iVar19;
  int *piVar20;
  bool bVar21;
  byte bVar22;
  type t;
  int local_27c;
  undefined1 local_268 [32];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [13];
  undefined3 uStack_1fb;
  int iStack_1f8;
  bool bStack_1f4;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [13];
  undefined3 uStack_17b;
  int iStack_178;
  bool bStack_174;
  undefined8 local_170;
  int *local_168;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  int *local_158;
  pointer local_150;
  int *local_148;
  int *local_140;
  long local_138;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar22 = 0;
  local_168 = nonz;
  local_160 = eps;
  local_268._0_16_ = (undefined1  [16])0x0;
  local_268._16_16_ = (undefined1  [16])0x0;
  local_248 = (undefined1  [16])0x0;
  local_238 = (undefined1  [16])0x0;
  local_228 = (undefined1  [16])0x0;
  local_218 = (undefined1  [16])0x0;
  local_208 = SUB1613((undefined1  [16])0x0,0);
  uStack_1fb = 0;
  iVar9 = (this->l).firstUpdate;
  iVar2 = (this->l).firstUnused;
  lVar18 = (long)iVar2;
  local_138 = (long)iVar9;
  local_27c = n;
  if (iVar9 < iVar2) {
    local_150 = (this->l).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_158 = (this->l).idx;
    local_140 = (this->l).row;
    local_148 = (this->l).start;
    do {
      piVar20 = local_148;
      iVar9 = local_148[lVar18 + -1];
      iVar2 = local_140[lVar18 + -1];
      pnVar1 = vec + iVar2;
      pnVar14 = pnVar1;
      puVar15 = (uint *)local_268;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        *puVar15 = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar22 * -2 + 1) * 4);
        puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
      }
      puVar15 = vec[iVar2].m_backend.data._M_elems + 1;
      iStack_1f8 = puVar15[0x1b];
      bStack_1f4 = *(bool *)(puVar15 + 0x1c);
      fVar3 = puVar15[0x1d];
      iVar4 = puVar15[0x1e];
      local_1f0 = *(undefined8 *)(puVar15 + 0x1d);
      puVar17 = local_130.data._M_elems + 1;
      for (lVar11 = 0x1b; lVar11 != 0; lVar11 = lVar11 + -1) {
        *puVar17 = *puVar15;
        puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
        puVar17 = puVar17 + (ulong)bVar22 * -2 + 1;
      }
      local_130.data._M_elems[0] = local_268._0_4_;
      local_130.exp = iStack_1f8;
      local_130.neg = (bool)((local_268._0_4_ != 0 || fVar3 != cpp_dec_float_finite) ^ bStack_1f4);
      local_130.fpclass = fVar3;
      local_130.prec_elem = iVar4;
      iVar19 = piVar20[lVar18];
      if (iVar2 < iVar19) {
        piVar20 = local_158 + iVar9;
        pcVar12 = &local_150[iVar9].m_backend;
        do {
          pcVar10 = &vec[*piVar20].m_backend;
          local_170._0_4_ = cpp_dec_float_finite;
          local_170._4_4_ = 0x1c;
          local_1e8 = (undefined1  [16])0x0;
          local_1d8 = (undefined1  [16])0x0;
          local_1c8 = (undefined1  [16])0x0;
          local_1b8 = (undefined1  [16])0x0;
          local_1a8 = (undefined1  [16])0x0;
          local_198 = (undefined1  [16])0x0;
          local_188 = SUB1613((undefined1  [16])0x0,0);
          uStack_17b = 0;
          iStack_178 = 0;
          bStack_174 = false;
          v = pcVar10;
          if ((pcVar12 != (cpp_dec_float<200U,_int,_void> *)local_1e8) &&
             (v = pcVar12, (cpp_dec_float<200U,_int,_void> *)local_1e8 != pcVar10)) {
            pcVar13 = pcVar10;
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_1e8;
            for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
              (pcVar16->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar22 * -8 + 4);
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar22 * -8 + 4);
            }
            iStack_178 = pcVar10->exp;
            bStack_174 = pcVar10->neg;
            local_170._0_4_ = pcVar10->fpclass;
            local_170._4_4_ = pcVar10->prec_elem;
          }
          piVar20 = piVar20 + 1;
          pcVar12 = pcVar12 + 1;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_1e8,v);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&local_130,(cpp_dec_float<200U,_int,_void> *)local_1e8);
          iVar19 = iVar19 + -1;
        } while (iVar2 < iVar19);
      }
      if ((fpclass_type)local_1f0 == cpp_dec_float_NaN) {
LAB_00548449:
        uVar7 = local_130.data._M_elems[0];
        puVar15 = local_130.data._M_elems + 1;
        puVar17 = (uint *)(local_268 + 4);
        for (lVar11 = 0x1b; lVar11 != 0; lVar11 = lVar11 + -1) {
          *puVar17 = *puVar15;
          puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
          puVar17 = puVar17 + (ulong)bVar22 * -2 + 1;
        }
        local_268._0_4_ = uVar7;
        iStack_1f8 = local_130.exp;
        bStack_1f4 = (bool)((uVar7 != 0 || local_130.fpclass != cpp_dec_float_finite) ^
                           local_130.neg);
        local_1f0._0_4_ = local_130.fpclass;
        local_1f0._4_4_ = local_130.prec_elem;
        if (local_130.fpclass == cpp_dec_float_NaN) {
LAB_005484c2:
          puVar15 = (uint *)local_268;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_1e8;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pcVar12->data)._M_elems[0] = *puVar15;
            puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar22 * -8 + 4);
          }
          iStack_178 = iStack_1f8;
          bStack_174 = bStack_1f4;
          local_170._0_4_ = (fpclass_type)local_1f0;
          local_170._4_4_ = local_1f0._4_4_;
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<200U,_int,_void> *)local_1e8,0,(type *)0x0);
          iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_268,
                             (cpp_dec_float<200U,_int,_void> *)local_1e8);
          if (iVar9 != 0) goto LAB_005484c2;
          local_170._0_4_ = cpp_dec_float_finite;
          local_170._4_4_ = 0x1c;
          local_1e8 = (undefined1  [16])0x0;
          local_1d8 = (undefined1  [16])0x0;
          local_1c8 = (undefined1  [16])0x0;
          local_1b8 = (undefined1  [16])0x0;
          local_1a8 = (undefined1  [16])0x0;
          local_198 = (undefined1  [16])0x0;
          local_188 = SUB1613((undefined1  [16])0x0,0);
          uStack_17b = 0;
          iStack_178 = 0;
          bStack_174 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_1e8,1e-100);
        }
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_1e8;
        pnVar14 = pnVar1;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pnVar14->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar22 * -8 + 4);
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar22 * -2 + 1) * 4);
        }
        (pnVar1->m_backend).exp = iStack_178;
        (pnVar1->m_backend).neg = bStack_174;
        (pnVar1->m_backend).fpclass = (fpclass_type)local_170;
        (pnVar1->m_backend).prec_elem = local_170._4_4_;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<200U,_int,_void> *)local_1e8,0,(type *)0x0);
        iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_268,
                           (cpp_dec_float<200U,_int,_void> *)local_1e8);
        uVar7 = local_130.data._M_elems[0];
        if (iVar9 != 0) goto LAB_00548449;
        puVar15 = local_130.data._M_elems + 1;
        puVar17 = (uint *)(local_268 + 4);
        for (lVar11 = 0x1b; iVar4 = local_130.prec_elem, fVar3 = local_130.fpclass,
            bVar8 = local_130.neg, iVar9 = local_130.exp, lVar11 != 0; lVar11 = lVar11 + -1) {
          *puVar17 = *puVar15;
          puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
          puVar17 = puVar17 + (ulong)bVar22 * -2 + 1;
        }
        local_268._0_4_ = uVar7;
        bVar21 = uVar7 != 0 || local_130.fpclass != cpp_dec_float_finite;
        bStack_1f4 = (bool)(local_130.neg ^ bVar21);
        iStack_1f8 = local_130.exp;
        local_1f0._4_4_ = local_130.prec_elem;
        local_1f0._0_4_ = local_130.fpclass;
        puVar15 = (uint *)local_268;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_1e8;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pcVar12->data)._M_elems[0] = *puVar15;
          puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar22 * -8 + 4);
        }
        pnVar14 = local_160;
        pcVar12 = &local_b0;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pcVar12->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar22 * -2 + 1) * 4);
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar22 * -2 + 1) * 4)
          ;
        }
        local_b0.exp = (local_160->m_backend).exp;
        local_b0.neg = (local_160->m_backend).neg;
        fVar5 = (local_160->m_backend).fpclass;
        iVar6 = (local_160->m_backend).prec_elem;
        local_b0.fpclass = fVar5;
        local_b0.prec_elem = iVar6;
        iStack_178 = iVar9;
        bStack_174 = bStack_1f4;
        local_170._4_4_ = iVar4;
        local_170._0_4_ = fVar3;
        if ((bVar8 != bVar21) && (local_1e8._0_4_ != 0 || fVar3 != cpp_dec_float_finite)) {
          bStack_174 = (bool)(bStack_1f4 ^ 1);
        }
        if ((fVar5 != cpp_dec_float_NaN && fVar3 != cpp_dec_float_NaN) &&
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_1e8,&local_b0), 0 < iVar9)) {
          lVar11 = (long)local_27c;
          local_27c = local_27c + 1;
          local_168[lVar11] = iVar2;
          puVar15 = (uint *)local_268;
          pnVar14 = pnVar1;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pnVar14->m_backend).data._M_elems[0] = *puVar15;
            puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
            pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar14 + ((ulong)bVar22 * -2 + 1) * 4);
          }
          (pnVar1->m_backend).exp = iStack_1f8;
          (pnVar1->m_backend).neg = bStack_1f4;
          (pnVar1->m_backend).fpclass = (fpclass_type)local_1f0;
          (pnVar1->m_backend).prec_elem = local_1f0._4_4_;
        }
      }
      lVar18 = lVar18 + -1;
    } while (local_138 < lVar18);
  }
  return local_27c;
}

Assistant:

int CLUFactor<R>::solveUpdateLeft(R eps, R* vec, int* nonz, int n)
{
   int i, j, k, end;
   R y;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates! */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      k = lbeg[i];
      assert(k >= 0 && k < l.size);
      val = &lval[k];
      idx = &lidx[k];

      k = lrow[i];

      y = vec[k];
      StableSum<R> tmp(-y);

      for(j = lbeg[i + 1]; j > k; --j)
      {
         assert(*idx >= 0 && *idx < thedim);
         tmp += vec[*idx++] * (*val++);
      }

      if(y == 0)
      {
         y = -R(tmp);

         if(isNotZero(y, eps))
         {
            nonz[n++] = k;
            vec[k] = y;
         }
      }
      else
      {
         y = -R(tmp);
         vec[k] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
      }
   }

   return n;
}